

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryInit
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemoryInit *curr)

{
  ExternalInterface *pEVar1;
  Name memory;
  undefined1 this_00 [8];
  long lVar2;
  element_type *peVar3;
  char *pcVar4;
  long lVar5;
  size_type sVar6;
  Address memorySize;
  Address AVar7;
  Name NVar8;
  Literal local_178;
  undefined1 local_160 [8];
  Literal addr;
  Flow dest;
  Flow offset;
  Flow size;
  undefined1 local_68 [8];
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&addr.type,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->dest);
  if (dest.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&dest.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->offset);
    if (offset.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&offset.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->size);
      if (size.breakTo.super_IString.str._M_len == 0) {
        NVar8.super_IString.str._M_str = (char *)(curr->segment).super_IString.str._M_len;
        NVar8.super_IString.str._M_len = (size_t)this->wasm;
        lVar2 = wasm::Module::getDataSegment(NVar8);
        if (((long)((long)dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   dest.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3
            ) * -0x5555555555555555 + addr.type.id != 1) {
LAB_0012d809:
          __assert_fail("values.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                        ,0x52,"const Literal &wasm::Flow::getSingleValue()");
        }
        peVar3 = (element_type *)wasm::Literal::getUnsigned();
        if (dest.breakTo.super_IString.str._M_str +
            ((long)((long)offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
            3) * -0x5555555555555555 != (char *)0x1) goto LAB_0012d809;
        pcVar4 = (char *)wasm::Literal::getUnsigned();
        size.breakTo.super_IString.str._M_str = (char *)__return_storage_ptr__;
        if (offset.breakTo.super_IString.str._M_str +
            ((long)((long)size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start -
                   size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3
            ) * -0x5555555555555555 != (char *)0x1) goto LAB_0012d809;
        lVar5 = wasm::Literal::getUnsigned();
        if (pcVar4 + lVar5 != (char *)0x0) {
          sVar6 = std::
                  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count(&(this->droppedDataSegments)._M_h,&curr->segment);
          if (sVar6 != 0) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds segment access in memory.init");
          }
        }
        if ((char *)(*(long *)(lVar2 + 0x40) - *(long *)(lVar2 + 0x38)) < pcVar4 + lVar5) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds segment access in memory.init");
        }
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)local_68,this,(Name)(curr->memory).super_IString.str);
        memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memory.super_IString.str._M_len = (size_t)info.instance;
        info.name.super_IString.str._M_str = pcVar4;
        memorySize = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_68,memory);
        if (memorySize.addr << 0x10 <
            (ulong)((long)(peVar3->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems +
                   lVar5 + -0x10)) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds memory access in memory.init");
        }
        if (lVar5 != 0) {
          do {
            this_00 = local_68;
            addr.field_0.func.super_IString.str._M_str = (char *)0x3;
            pEVar1 = *(ExternalInterface **)((long)local_68 + 0x200);
            local_160 = (undefined1  [8])peVar3;
            wasm::Literal::Literal(&local_178,(Literal *)local_160);
            AVar7 = getFinalAddressWithoutOffset
                              ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,&local_178,1,
                               memorySize);
            pcVar4 = info.name.super_IString.str._M_str;
            (*pEVar1->_vptr_ExternalInterface[0x16])
                      (pEVar1,AVar7.addr,
                       (ulong)(uint)(int)info.name.super_IString.str._M_str[*(long *)(lVar2 + 0x38)]
                       ,info.instance,info.name.super_IString.str._M_len);
            wasm::Literal::~Literal(&local_178);
            wasm::Literal::~Literal((Literal *)local_160);
            peVar3 = (element_type *)((long)&(peVar3->type).id + 1);
            info.name.super_IString.str._M_str = pcVar4 + 1;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
        size.breakTo.super_IString.str._M_str[0x30] = '\0';
        size.breakTo.super_IString.str._M_str[0x31] = '\0';
        size.breakTo.super_IString.str._M_str[0x32] = '\0';
        size.breakTo.super_IString.str._M_str[0x33] = '\0';
        size.breakTo.super_IString.str._M_str[0x34] = '\0';
        size.breakTo.super_IString.str._M_str[0x35] = '\0';
        size.breakTo.super_IString.str._M_str[0x36] = '\0';
        size.breakTo.super_IString.str._M_str[0x37] = '\0';
        size.breakTo.super_IString.str._M_str[0x38] = '\0';
        size.breakTo.super_IString.str._M_str[0x39] = '\0';
        size.breakTo.super_IString.str._M_str[0x3a] = '\0';
        size.breakTo.super_IString.str._M_str[0x3b] = '\0';
        size.breakTo.super_IString.str._M_str[0x3c] = '\0';
        size.breakTo.super_IString.str._M_str[0x3d] = '\0';
        size.breakTo.super_IString.str._M_str[0x3e] = '\0';
        size.breakTo.super_IString.str._M_str[0x3f] = '\0';
        size.breakTo.super_IString.str._M_str[0x20] = '\0';
        size.breakTo.super_IString.str._M_str[0x21] = '\0';
        size.breakTo.super_IString.str._M_str[0x22] = '\0';
        size.breakTo.super_IString.str._M_str[0x23] = '\0';
        size.breakTo.super_IString.str._M_str[0x24] = '\0';
        size.breakTo.super_IString.str._M_str[0x25] = '\0';
        size.breakTo.super_IString.str._M_str[0x26] = '\0';
        size.breakTo.super_IString.str._M_str[0x27] = '\0';
        size.breakTo.super_IString.str._M_str[0x28] = '\0';
        size.breakTo.super_IString.str._M_str[0x29] = '\0';
        size.breakTo.super_IString.str._M_str[0x2a] = '\0';
        size.breakTo.super_IString.str._M_str[0x2b] = '\0';
        size.breakTo.super_IString.str._M_str[0x2c] = '\0';
        size.breakTo.super_IString.str._M_str[0x2d] = '\0';
        size.breakTo.super_IString.str._M_str[0x2e] = '\0';
        size.breakTo.super_IString.str._M_str[0x2f] = '\0';
        size.breakTo.super_IString.str._M_str[0x10] = '\0';
        size.breakTo.super_IString.str._M_str[0x11] = '\0';
        size.breakTo.super_IString.str._M_str[0x12] = '\0';
        size.breakTo.super_IString.str._M_str[0x13] = '\0';
        size.breakTo.super_IString.str._M_str[0x14] = '\0';
        size.breakTo.super_IString.str._M_str[0x15] = '\0';
        size.breakTo.super_IString.str._M_str[0x16] = '\0';
        size.breakTo.super_IString.str._M_str[0x17] = '\0';
        size.breakTo.super_IString.str._M_str[0x18] = '\0';
        size.breakTo.super_IString.str._M_str[0x19] = '\0';
        size.breakTo.super_IString.str._M_str[0x1a] = '\0';
        size.breakTo.super_IString.str._M_str[0x1b] = '\0';
        size.breakTo.super_IString.str._M_str[0x1c] = '\0';
        size.breakTo.super_IString.str._M_str[0x1d] = '\0';
        size.breakTo.super_IString.str._M_str[0x1e] = '\0';
        size.breakTo.super_IString.str._M_str[0x1f] = '\0';
        size.breakTo.super_IString.str._M_str[0] = '\0';
        size.breakTo.super_IString.str._M_str[1] = '\0';
        size.breakTo.super_IString.str._M_str[2] = '\0';
        size.breakTo.super_IString.str._M_str[3] = '\0';
        size.breakTo.super_IString.str._M_str[4] = '\0';
        size.breakTo.super_IString.str._M_str[5] = '\0';
        size.breakTo.super_IString.str._M_str[6] = '\0';
        size.breakTo.super_IString.str._M_str[7] = '\0';
        size.breakTo.super_IString.str._M_str[8] = '\0';
        size.breakTo.super_IString.str._M_str[9] = '\0';
        size.breakTo.super_IString.str._M_str[10] = '\0';
        size.breakTo.super_IString.str._M_str[0xb] = '\0';
        size.breakTo.super_IString.str._M_str[0xc] = '\0';
        size.breakTo.super_IString.str._M_str[0xd] = '\0';
        size.breakTo.super_IString.str._M_str[0xe] = '\0';
        size.breakTo.super_IString.str._M_str[0xf] = '\0';
        size.breakTo.super_IString.str._M_str[0x40] = '\0';
        size.breakTo.super_IString.str._M_str[0x41] = '\0';
        size.breakTo.super_IString.str._M_str[0x42] = '\0';
        size.breakTo.super_IString.str._M_str[0x43] = '\0';
        size.breakTo.super_IString.str._M_str[0x44] = '\0';
        size.breakTo.super_IString.str._M_str[0x45] = '\0';
        size.breakTo.super_IString.str._M_str[0x46] = '\0';
        size.breakTo.super_IString.str._M_str[0x47] = '\0';
        __return_storage_ptr__ = (Flow *)size.breakTo.super_IString.str._M_str;
      }
      else {
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             (size_t)offset.breakTo.super_IString.str._M_str;
        wasm::Literal::Literal
                  ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                   _M_elems,(Literal *)&size);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish =
             size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
        size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len =
             (size_t)size.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str =
             (char *)size.breakTo.super_IString.str._M_len;
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &size.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      wasm::Literal::~Literal((Literal *)&size);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)dest.breakTo.super_IString.str._M_str;
      wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)&offset);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)offset.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)offset.breakTo.super_IString.str._M_len;
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &offset.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    wasm::Literal::~Literal((Literal *)&offset);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = addr.type.id;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&dest);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)dest.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    dest.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)dest.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)dest.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &dest.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&dest);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemoryInit(MemoryInit* curr) {
    NOTE_ENTER("MemoryInit");
    Flow dest = self()->visit(curr->dest);
    if (dest.breaking()) {
      return dest;
    }
    Flow offset = self()->visit(curr->offset);
    if (offset.breaking()) {
      return offset;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    NOTE_EVAL1(dest);
    NOTE_EVAL1(offset);
    NOTE_EVAL1(size);

    auto* segment = wasm.getDataSegment(curr->segment);

    Address destVal(dest.getSingleValue().getUnsigned());
    Address offsetVal(offset.getSingleValue().getUnsigned());
    Address sizeVal(size.getSingleValue().getUnsigned());

    if (offsetVal + sizeVal > 0 && droppedDataSegments.count(curr->segment)) {
      trap("out of bounds segment access in memory.init");
    }
    if (offsetVal + sizeVal > segment->data.size()) {
      trap("out of bounds segment access in memory.init");
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    if (destVal + sizeVal > memorySize * Memory::kPageSize) {
      trap("out of bounds memory access in memory.init");
    }
    for (size_t i = 0; i < sizeVal; ++i) {
      Literal addr(destVal + i);
      info.interface()->store8(
        info.instance->getFinalAddressWithoutOffset(addr, 1, memorySize),
        segment->data[offsetVal + i],
        info.name);
    }
    return {};
  }